

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O3

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageFloat *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  float *pfVar2;
  float ***pppfVar3;
  undefined1 auVar4 [16];
  ImageFloat *pIVar5;
  undefined1 uVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long *plVar13;
  IOException *this_00;
  long lVar14;
  long lVar15;
  long *plVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  void *pvVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  pos_type pVar31;
  undefined1 auStack_3f8 [12];
  uint local_3ec;
  long local_3e8;
  ImageFloat *local_3e0;
  void *local_3d8;
  void *local_3d0;
  void *local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  ulong local_3a8;
  long local_3a0;
  ulong local_398;
  long local_390;
  ulong local_388;
  string s;
  int subbit;
  long local_358;
  long local_350;
  long lStack_348;
  ulong local_340;
  ulong local_338;
  ulong local_330;
  int depth;
  Properties prop;
  long local_2e0;
  __mbstate_t local_2d8;
  long height;
  long width;
  long local_2a8;
  void *local_2a0;
  void *local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long maxval;
  float scale;
  ifstream in;
  uint uStack_254;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_248;
  unsigned_short **ppuStack_238;
  unsigned_short **local_230;
  unsigned_short ***pppuStack_228;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_3e0 = image;
  local_3c0 = x;
  local_3b0 = y;
  uVar6 = gutil::isMSBFirst();
  local_3b8 = CONCAT71(local_3b8._1_7_,uVar6);
  iVar8 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar8 == '\0') {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&s,name,(allocator *)&subbit);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop,
                   "Can only load PNM image (",&s);
    plVar13 = (long *)std::__cxx11::string::append((char *)&prop);
    _in = (pointer)*plVar13;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_in == paVar17) {
      aStack_248._M_allocated_capacity = paVar17->_M_allocated_capacity;
      aStack_248._8_8_ = plVar13[3];
      _in = (pointer)&aStack_248;
    }
    else {
      aStack_248._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    *plVar13 = (long)paVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    gutil::IOException::IOException(this_00,(string *)&in);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pVar31 = anon_unknown_11::readPNMHeader(name,&depth,&maxval,&scale,&width,&height);
  pIVar5 = local_3e0;
  local_3d8 = (void *)CONCAT44(local_3d8._4_4_,scale);
  if ((scale != 0.0) || (NAN(scale))) {
    uVar20 = 1;
    if (1 < ds) {
      uVar20 = (ulong)(uint)ds;
    }
    if (w < 0) {
      w = (long)(width + uVar20 + -1) / (long)uVar20;
    }
    if (h < 0) {
      h = (long)(height + uVar20 + -1) / (long)uVar20;
    }
    local_3a8 = (ulong)depth;
    Image<float,_gimage::PixelTraits<float>_>::setSize(local_3e0,w,h,local_3a8);
    auVar4 = _DAT_0012f030;
    lVar18 = pIVar5->n;
    if (lVar18 != 0) {
      lVar24 = -lVar18;
      if (0 < lVar18) {
        lVar24 = lVar18;
      }
      pfVar2 = local_3e0->pixel;
      lVar18 = lVar24 + -1;
      auVar26._8_4_ = (int)lVar18;
      auVar26._0_8_ = lVar18;
      auVar26._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar19 = 0;
      auVar26 = auVar26 ^ _DAT_0012f030;
      auVar27 = _DAT_0012f010;
      auVar28 = _DAT_0012f020;
      do {
        auVar29 = auVar28 ^ auVar4;
        iVar8 = auVar26._4_4_;
        if ((bool)(~(auVar29._4_4_ == iVar8 && auVar26._0_4_ < auVar29._0_4_ ||
                    iVar8 < auVar29._4_4_) & 1)) {
          pfVar2[uVar19] = INFINITY;
        }
        if ((auVar29._12_4_ != auVar26._12_4_ || auVar29._8_4_ <= auVar26._8_4_) &&
            auVar29._12_4_ <= auVar26._12_4_) {
          pfVar2[uVar19 + 1] = INFINITY;
        }
        auVar29 = auVar27 ^ auVar4;
        iVar30 = auVar29._4_4_;
        if (iVar30 <= iVar8 && (iVar30 != iVar8 || auVar29._0_4_ <= auVar26._0_4_)) {
          pfVar2[uVar19 + 2] = INFINITY;
          pfVar2[uVar19 + 3] = INFINITY;
        }
        uVar19 = uVar19 + 4;
        lVar18 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 4;
        auVar28._8_8_ = lVar18 + 4;
        lVar18 = auVar27._8_8_;
        auVar27._0_8_ = auVar27._0_8_ + 4;
        auVar27._8_8_ = lVar18 + 4;
      } while ((lVar24 + 3U & 0xfffffffffffffffc) != uVar19);
    }
    std::ifstream::ifstream(&in);
    lVar18 = *(long *)(_in + -0x18);
    *(undefined4 *)((long)&aStack_248 + lVar18 + 0xc) = 7;
    std::ios::clear((int)(auStack_3f8 + lVar18) + 0x1a0);
    std::ifstream::open((char *)&in,(_Ios_Openmode)name);
    local_388 = local_3a8 & 0xffffffff;
    local_3e8 = width;
    local_3a0 = height;
    local_2e0 = pVar31._M_off;
    local_2d8 = pVar31._M_state;
    local_390 = w;
    if ((((ds < 2) && (local_3b0 == 0 && local_3c0 == 0)) && (w == width)) && (h == height)) {
      std::istream::seekg(&in,local_2e0,local_2d8);
      if (0 < h) {
        bVar7 = 0.0 <= local_3d8._0_4_;
        if ((char)local_3b8 != '\0') {
          bVar7 = local_3d8._0_4_ <= 0.0;
        }
        local_3d8 = (void *)CONCAT44(local_3d8._4_4_,(uint)bVar7);
        local_330 = local_3a8 & 0xffffffff;
        do {
          lVar18 = h + -1;
          if (0 < w) {
            lVar24 = 0;
            local_3e8 = h;
            local_3b8 = lVar18;
            do {
              if (0 < (int)local_388) {
                uVar20 = 0;
                do {
                  if ((char)local_3d8 == '\0') {
                    if (ppuStack_238 < local_230) {
                      uVar23 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar23 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      h = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar10 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar10 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      h = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar11 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar11 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      h = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar9 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar9 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      h = local_3e8;
                    }
                    uVar9 = uVar9 << 0x18;
                    uVar23 = (uVar11 & 0xff) << 0x10 | (uVar10 & 0xff) << 8 | uVar23 & 0xff;
                  }
                  else {
                    if (ppuStack_238 < local_230) {
                      uVar10 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar10 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      h = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar11 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar11 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      h = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar9 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar9 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      h = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar23 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar23 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      h = local_3e8;
                    }
                    uVar9 = (uVar9 & 0xff) << 8 | (uVar11 & 0xff) << 0x10 | uVar10 << 0x18;
                    uVar23 = uVar23 & 0xff;
                  }
                  local_3e0->img[uVar20][local_3b8][lVar24] = (float)(uVar23 | uVar9);
                  uVar20 = uVar20 + 1;
                  lVar18 = local_3b8;
                } while (local_330 != uVar20);
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 != local_390);
          }
          bVar7 = 1 < h;
          h = lVar18;
          w = local_390;
        } while (bVar7);
      }
    }
    else {
      lVar18 = w * local_3a8;
      local_340 = lVar18 * 4;
      local_3c8 = operator_new(local_340);
      uVar19 = local_340;
      if (lVar18 != 0) {
        memset(local_3c8,0,local_340);
      }
      local_3d0 = operator_new(uVar19);
      if (lVar18 != 0) {
        memset(local_3d0,0,local_340);
      }
      lVar24 = 0;
      if (-local_3b0 != 0 && local_3b0 < 1) {
        lVar24 = -local_3b0;
      }
      if (lVar24 < h) {
        local_290 = 0;
        if (0 < local_3c0) {
          local_290 = local_3c0;
        }
        local_290 = local_290 * uVar20;
        lVar21 = local_3a8 * 4;
        lVar22 = -local_3c0;
        if (-local_3c0 == 0 || 0 < local_3c0) {
          lVar22 = 0;
        }
        local_2a8 = lVar22 * local_3a8;
        bVar7 = 0.0 <= local_3d8._0_4_;
        if ((char)local_3b8 != '\0') {
          bVar7 = local_3d8._0_4_ <= 0.0;
        }
        local_3ec = (uint)bVar7;
        local_278 = (long)ds;
        local_298 = (void *)((long)local_3d0 + local_2a8 * 4);
        local_2a0 = (void *)((long)local_3c8 + local_2a8 * 4);
        local_3b8 = h;
        local_398 = uVar20;
LAB_00116e1a:
        uVar20 = local_340;
        local_338 = (lVar24 + local_3b0) * local_398;
        if ((long)local_338 < local_3a0) {
          if (lVar18 != 0) {
            memset(local_3c8,0,local_340);
            memset(local_3d0,0,uVar20);
          }
          local_288 = ~local_338 + local_3a0;
          uVar20 = 0;
          do {
            while (std::istream::seekg(&in,((local_288 - uVar20) * local_3e8 + local_290) * lVar21 +
                                           local_2e0,local_2d8), w <= lVar22) {
              if ((local_398 <= uVar20 + 1) ||
                 (lVar14 = local_338 + uVar20, uVar20 = uVar20 + 1, local_3a0 <= lVar14 + 1))
              goto LAB_0011734a;
            }
            local_3d8 = local_298;
            lVar14 = lVar22;
            pvVar25 = local_2a0;
            uVar23 = local_3ec;
            do {
              local_270 = (local_3c0 + lVar14) * local_398;
              if (local_3e8 <= local_270) break;
              uVar19 = 0;
              local_280 = lVar14;
              do {
                local_330 = uVar19;
                if (0 < (int)local_388) {
                  uVar19 = 0;
                  do {
                    if ((char)uVar23 == '\0') {
                      if (ppuStack_238 < local_230) {
                        uVar10 = (uint)*(byte *)ppuStack_238;
                        ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                      }
                      else {
                        uVar10 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248)
                        ;
                        uVar23 = local_3ec;
                      }
                      if (ppuStack_238 < local_230) {
                        uVar11 = (uint)*(byte *)ppuStack_238;
                        ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                      }
                      else {
                        uVar11 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248)
                        ;
                        uVar23 = local_3ec;
                      }
                      if (ppuStack_238 < local_230) {
                        uVar9 = (uint)*(byte *)ppuStack_238;
                        ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                      }
                      else {
                        uVar9 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                        uVar23 = local_3ec;
                      }
                      if (ppuStack_238 < local_230) {
                        uVar12 = (uint)*(byte *)ppuStack_238;
                        ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                      }
                      else {
                        uVar12 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248)
                        ;
                        uVar23 = local_3ec;
                      }
                      uVar12 = uVar12 << 0x18;
                      uVar10 = (uVar9 & 0xff) << 0x10 | (uVar11 & 0xff) << 8 | uVar10 & 0xff;
                    }
                    else {
                      if (ppuStack_238 < local_230) {
                        uVar11 = (uint)*(byte *)ppuStack_238;
                        ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                      }
                      else {
                        uVar11 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248)
                        ;
                        uVar23 = local_3ec;
                      }
                      if (ppuStack_238 < local_230) {
                        uVar9 = (uint)*(byte *)ppuStack_238;
                        ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                      }
                      else {
                        uVar9 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                        uVar23 = local_3ec;
                      }
                      if (ppuStack_238 < local_230) {
                        uVar12 = (uint)*(byte *)ppuStack_238;
                        ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                      }
                      else {
                        uVar12 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248)
                        ;
                        uVar23 = local_3ec;
                      }
                      if (ppuStack_238 < local_230) {
                        uVar10 = (uint)*(byte *)ppuStack_238;
                        ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                      }
                      else {
                        uVar10 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248)
                        ;
                        uVar23 = local_3ec;
                      }
                      uVar12 = (uVar12 & 0xff) << 8 | (uVar9 & 0xff) << 0x10 | uVar11 << 0x18;
                      uVar10 = uVar10 & 0xff;
                    }
                    if ((uVar10 | uVar12 & 0x7fffffff) < 0x7f800000) {
                      *(float *)((long)pvVar25 + uVar19 * 4) =
                           (float)(uVar10 | uVar12) + *(float *)((long)pvVar25 + uVar19 * 4);
                      piVar1 = (int *)((long)local_3d8 + uVar19 * 4);
                      *piVar1 = *piVar1 + 1;
                    }
                    uVar19 = uVar19 + 1;
                    h = local_3b8;
                  } while (local_388 != uVar19);
                }
                uVar19 = local_330 + 1;
              } while (((long)uVar19 < local_278) && ((long)(local_270 + local_330 + 1) < local_3e8)
                      );
              lVar14 = local_280 + 1;
              local_3d8 = (void *)((long)local_3d8 + lVar21);
              pvVar25 = (void *)((long)pvVar25 + lVar21);
            } while (lVar14 != local_390);
            w = local_390;
          } while ((uVar20 + 1 < local_398) &&
                  (lVar14 = local_338 + uVar20, uVar20 = uVar20 + 1, lVar14 + 1 < local_3a0));
          lVar14 = lVar22;
          lVar15 = local_2a8;
          if (lVar22 < local_390) goto LAB_001172d3;
          goto LAB_0011734a;
        }
      }
LAB_00117359:
      operator_delete(local_3d0);
      operator_delete(local_3c8);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    return;
  }
  if (maxval < 0x100) {
    _in = (pointer)((ulong)uStack_254 << 0x20);
    aStack_248._M_allocated_capacity = 0;
    aStack_248._8_8_ = 0;
    ppuStack_238 = (unsigned_short **)0x0;
    local_230 = (unsigned_short **)0x0;
    pppuStack_228 = (unsigned_short ***)0x0;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,0,0,1);
    (*(this->super_BasicImageIO)._vptr_BasicImageIO[6])
              (this,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,name,
               (ulong)(uint)ds,local_3c0,local_3b0,w,h);
    Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_char>
              (local_3e0,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    return;
  }
  _in = (pointer)((ulong)uStack_254 << 0x20);
  aStack_248._M_allocated_capacity = 0;
  aStack_248._8_8_ = 0;
  ppuStack_238 = (unsigned_short **)0x0;
  local_230 = (unsigned_short **)0x0;
  pppuStack_228 = (unsigned_short ***)0x0;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in,0,0,1);
  (*(this->super_BasicImageIO)._vptr_BasicImageIO[7])
            (this,(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in,name,
             (ulong)(uint)ds,local_3c0,local_3b0,w,h);
  Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_short>
            (local_3e0,(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in);
  std::__cxx11::string::string((string *)&s,name,(allocator *)&prop);
  lVar18 = std::__cxx11::string::rfind((char *)&s,0x12f36c,0xffffffffffffffff);
  if (lVar18 == s._M_string_length - 9) {
    std::__cxx11::string::rfind((char *)&s,0x12f36c,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&prop,(ulong)&s);
    std::__cxx11::string::operator=((string *)&s,(string *)&prop);
    if ((_Base_ptr *)prop.data._M_t._M_impl._0_8_ ==
        &prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) goto LAB_001174ac;
  }
  else {
    lVar18 = std::__cxx11::string::rfind((char *)&s,0x12f376,0xffffffffffffffff);
    if (lVar18 != s._M_string_length - 0xb) {
      std::__cxx11::string::_M_replace((ulong)&s,0,(char *)s._M_string_length,0x12f411);
      goto LAB_001174ac;
    }
    std::__cxx11::string::rfind((char *)&s,0x12f376,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&prop,(ulong)&s);
    std::__cxx11::string::operator=((string *)&s,(string *)&prop);
    if ((_Base_ptr *)prop.data._M_t._M_impl._0_8_ ==
        &prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) goto LAB_001174ac;
  }
  operator_delete((void *)prop.data._M_t._M_impl._0_8_);
LAB_001174ac:
  if (s._M_string_length != 0) {
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar18 = std::__cxx11::string::rfind((char)&s,0x5f);
    if ((lVar18 != -1) && (lVar18 = std::__cxx11::string::rfind((char)&s,0x5f), lVar18 != -1)) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&s);
      plVar13 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar16 = plVar13 + 2;
      if ((long *)*plVar13 == plVar16) {
        local_350 = *plVar16;
        lStack_348 = plVar13[3];
        _subbit = &local_350;
      }
      else {
        local_350 = *plVar16;
        _subbit = (long *)*plVar13;
      }
      local_358 = plVar13[1];
      *plVar13 = (long)plVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      gutil::Properties::load((char *)&prop);
      if (_subbit != &local_350) {
        operator_delete(_subbit);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    _subbit = &local_350;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&subbit,s._M_dataplus._M_p,s._M_dataplus._M_p + s._M_string_length);
    std::__cxx11::string::append((char *)&subbit);
    gutil::Properties::load((char *)&prop);
    if (_subbit != &local_350) {
      operator_delete(_subbit);
    }
    bVar7 = gutil::Properties::contains(&prop,"subbit");
    if (bVar7) {
      lVar18 = local_3e0->height;
      if (0 < lVar18) {
        lVar24 = local_3e0->width;
        pppfVar3 = local_3e0->img;
        lVar21 = 0;
        do {
          if (0 < lVar24) {
            pfVar2 = (*pppfVar3)[lVar21];
            lVar22 = 0;
            do {
              if (32767.0 < pfVar2[lVar22]) {
                pfVar2[lVar22] = INFINITY;
              }
              lVar22 = lVar22 + 1;
            } while (lVar24 != lVar22);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != lVar18);
      }
      gutil::Properties::getValue<int>(&prop,"subbit",&subbit,(char *)0x0);
      if (0 < subbit) {
        operator/=(local_3e0,(double)(1 << ((byte)_subbit & 0x1f)));
      }
    }
    bVar7 = gutil::Properties::contains(&prop,"origin.d");
    if (bVar7) {
      gutil::Properties::getValue<double>(&prop,"origin.d",(double *)&subbit,(char *)0x0);
      if (((double)_subbit != 0.0) || (NAN((double)_subbit))) {
        operator+=(local_3e0,(float)(double)_subbit);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&prop);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p);
  }
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image
            ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in);
  return;
  while( true ) {
    if (0 < (int)local_3a8) {
      pppfVar3 = local_3e0->img;
      uVar20 = 0;
      do {
        iVar8 = *(int *)((long)local_3d0 + uVar20 * 4 + lVar15 * 4);
        if (0 < iVar8) {
          pppfVar3[uVar20][lVar24][lVar14] =
               *(float *)((long)local_3c8 + uVar20 * 4 + lVar15 * 4) / (float)iVar8;
        }
        uVar20 = uVar20 + 1;
      } while (local_388 != uVar20);
      lVar15 = lVar15 + uVar20;
    }
    lVar14 = lVar14 + 1;
    if (lVar14 == local_390) break;
LAB_001172d3:
    if (local_3e8 <= (long)((local_3c0 + lVar14) * local_398)) break;
  }
LAB_0011734a:
  lVar24 = lVar24 + 1;
  if (lVar24 == h) goto LAB_00117359;
  goto LAB_00116e1a;
}

Assistant:

void PNMImageIO::load(ImageFloat &image, const char *name, int ds, long x,
                      long y, long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;
  float p;
  char *c=reinterpret_cast<char *>(&p);
  bool msbfirst=gutil::isMSBFirst();

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, depth);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(name, std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<float> vline(0.0f, w*depth);
        std::valarray<int> nline(0, w*depth);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(pos+static_cast<std::streamoff>(height-1-(y+k)*ds-kk)*width*depth*4+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*depth*4);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x)*depth;

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                for (int d=0; d<depth; d++)
                {
                  // we assume that the plattform uses IEEE 32 bit floating
                  // point format, otherwise this will not work

                  if ((scale > 0 && msbfirst) || (scale < 0 && !msbfirst))
                  {
                    c[0]=sb->sbumpc();
                    c[1]=sb->sbumpc();
                    c[2]=sb->sbumpc();
                    c[3]=sb->sbumpc();
                  }
                  else
                  {
                    c[3]=sb->sbumpc();
                    c[2]=sb->sbumpc();
                    c[1]=sb->sbumpc();
                    c[0]=sb->sbumpc();
                  }

                  if (image.isValidS(p))
                  {
                    vline[j+d]+=p;
                    nline[j+d]++;
                  }
                }
              }

              j+=depth;
            }
          }

          // store line into image

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              if (nline[j] > 0)
              {
                image.set(i, k, d, vline[j]/nline[j]);
              }

              j++;
            }
          }
        }
      }
      else // load whole image
      {
        in.seekg(pos);
        std::streambuf *sb=in.rdbuf();

        for (long k=height-1; k>=0; k--)
        {
          for (long i=0; i<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              // we assume that the plattform uses IEEE 32 bit floating
              // point format, otherwise this will not work

              if ((scale > 0 && msbfirst) || (scale < 0 && !msbfirst))
              {
                c[0]=sb->sbumpc();
                c[1]=sb->sbumpc();
                c[2]=sb->sbumpc();
                c[3]=sb->sbumpc();
              }
              else
              {
                c[3]=sb->sbumpc();
                c[2]=sb->sbumpc();
                c[1]=sb->sbumpc();
                c[0]=sb->sbumpc();
              }

              image.set(i, k, d, p);
            }
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else if (maxval > 255)
  {
    ImageU16 imageu16;
    load(imageu16, name, ds, x, y, w, h);
    image.setImageLimited(imageu16);

    // support for reading legacy disparity images in fixed point format

    std::string s=name;

    if (s.rfind("_disp.pgm") == s.size()-9)
    {
      s=s.substr(0, s.rfind("_disp.pgm"));
    }
    else if (s.rfind("_height.pgm") == s.size()-11)
    {
      s=s.substr(0, s.rfind("_height.pgm"));
    }
    else
    {
      s="";
    }

    if (s.size() > 0)
    {
      gutil::Properties prop;

      try
      {
        size_t pos=s.rfind('_');

        if (pos != s.npos)
        {
          pos=s.rfind('_', pos-1);
        }

        if (pos != s.npos)
        {
          prop.load((s.substr(0, pos)+"_param.txt").c_str());
        }
      }
      catch (const std::exception &)
      { }

      try
      {
        prop.load((s+"_param.txt").c_str());
      }
      catch (const std::exception &)
      { }

      if (prop.contains("subbit"))
      {
        // invalid disparities in legacy disparity images have a value > 32767

        for (long k=0; k<image.getHeight(); k++)
        {
          for (long i=0; i<image.getWidth(); i++)
          {
            if (image.get(i, k) > 32767)
            {
              image.setInvalid(i, k, 0);
            }
          }
        }

        // consider sub-pixel setting

        int subbit;
        prop.getValue("subbit", subbit);

        if (subbit > 0)
        {
          image/=1<<subbit;
        }
      }

      // consider offset

      if (prop.contains("origin.d"))
      {
        double offset;
        prop.getValue("origin.d", offset);

        if (offset != 0)
        {
          image+=static_cast<float>(offset);
        }
      }
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}